

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O0

int cmp_msg(long *msg,long *msg2,int n,int i)

{
  int local_2c;
  int j;
  int i_local;
  int n_local;
  long *msg2_local;
  long *msg_local;
  
  local_2c = 0;
  while( true ) {
    if (n <= local_2c) {
      return 1;
    }
    if (msg[local_2c] != msg2[local_2c]) break;
    local_2c = local_2c + 1;
  }
  printf("Received message %d doesn\'t match sent message\n",(ulong)(uint)i);
  printf("in: ");
  print_msg(msg,n);
  printf("\n");
  printf("out:");
  print_msg(msg2,n);
  printf("\n");
  return 0;
}

Assistant:

int cmp_msg(long msg[], long msg2[], int n, int i)
{
    int j;
    for (j = 0; j < n; j++) {
        if (msg[j] != msg2[j]) {
            printf("Received message %d doesn't match sent message\n", i);
            printf("in: "); print_msg(msg, n); printf("\n");
            printf("out:"); print_msg(msg2, n); printf("\n");
            return FALSE;
        }
    }
    return TRUE;
}